

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_upgrade_tls(connectdata *conn)

{
  imap_conn *imapc;
  CURLcode result;
  connectdata *conn_local;
  
  imapc._4_4_ = Curl_ssl_connect_nonblocking(conn,0,&(conn->proto).imapc.ssldone);
  if (imapc._4_4_ == CURLE_OK) {
    if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
      state(conn,IMAP_UPGRADETLS);
    }
    if (((conn->proto).imapc.ssldone & 1U) != 0) {
      imap_to_imaps(conn);
      imapc._4_4_ = imap_perform_capability(conn);
    }
  }
  return imapc._4_4_;
}

Assistant:

static CURLcode imap_perform_upgrade_tls(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  /* Start the SSL connection */
  result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &imapc->ssldone);

  if(!result) {
    if(imapc->state != IMAP_UPGRADETLS)
      state(conn, IMAP_UPGRADETLS);

    if(imapc->ssldone) {
      imap_to_imaps(conn);
      result = imap_perform_capability(conn);
    }
  }

  return result;
}